

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

void snprintf_can_error_frame(char *buf,size_t len,canfd_frame *cf,char *sep)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int local_3c;
  
  uVar1 = cf->can_id;
  if ((uVar1 >> 0x1d & 1) != 0) {
    if (0x200 < (uVar1 & 0x1fffffff)) {
      fprintf(_stderr,"Error class %#x is invalid\n");
      return;
    }
    pcVar6 = ",";
    if (sep != (char *)0x0) {
      pcVar6 = sep;
    }
    uVar12 = 0;
    lVar11 = 0;
    local_3c = 0;
    iVar10 = 0;
    do {
      if ((uVar1 >> (uVar12 & 0x1f) & 1) != 0) {
        if (local_3c == 0) {
LAB_00104703:
          uVar7 = len - (long)iVar10;
          bVar2 = false;
          uVar3 = snprintf(buf + iVar10,uVar7,"%s",
                           (long)&error_classes_rel +
                           (long)*(int *)((long)&error_classes_rel + lVar11));
          if (uVar3 < uVar7 && -1 < (int)uVar3) {
            iVar10 = uVar3 + iVar10;
            if (lVar11 == 4) {
              iVar4 = 0;
              sVar9 = len - (long)iVar10;
              if (sVar9 != 0) {
                iVar4 = snprintf(buf + iVar10,sVar9,"{at bit %d}",(ulong)cf->data[0]);
              }
              iVar10 = iVar10 + iVar4;
            }
            if (lVar11 == 8) {
              iVar4 = 0;
              sVar9 = len - (long)iVar10;
              if (sVar9 != 0) {
                pcVar8 = buf + iVar10;
                iVar4 = snprintf(pcVar8,sVar9,"{");
                iVar5 = snprintf_error_data(pcVar8 + iVar4,sVar9 - (long)iVar4,cf->data[1],
                                            controller_problems,7);
                iVar4 = iVar4 + iVar5;
                iVar5 = snprintf(pcVar8 + iVar4,sVar9 - (long)iVar4,"}");
                iVar4 = iVar4 + iVar5;
              }
              iVar10 = iVar10 + iVar4;
            }
            if (lVar11 == 0xc) {
              iVar4 = 0;
              sVar9 = len - (long)iVar10;
              if (sVar9 != 0) {
                pcVar8 = buf + iVar10;
                iVar4 = snprintf(pcVar8,sVar9,"{{");
                iVar5 = snprintf_error_data(pcVar8 + iVar4,sVar9 - (long)iVar4,cf->data[2],
                                            protocol_violation_types,8);
                iVar4 = iVar4 + iVar5;
                iVar5 = snprintf(pcVar8 + iVar4,sVar9 - (long)iVar4,"}{");
                iVar4 = iVar4 + iVar5;
                if ((byte)(cf->data[3] - 1) < 0x1f) {
                  iVar5 = snprintf(pcVar8 + iVar4,sVar9 - (long)iVar4,"%s",
                                   protocol_violation_locations_rel +
                                   *(int *)(protocol_violation_locations_rel +
                                           (ulong)cf->data[3] * 4));
                  iVar4 = iVar4 + iVar5;
                }
                iVar5 = snprintf(pcVar8 + iVar4,sVar9 - (long)iVar4,"}}");
                iVar4 = iVar4 + iVar5;
              }
              iVar10 = iVar4 + iVar10;
            }
            local_3c = local_3c + 1;
            bVar2 = true;
          }
        }
        else {
          uVar7 = len - (long)iVar10;
          bVar2 = false;
          uVar3 = snprintf(buf + iVar10,uVar7,"%s",pcVar6);
          if (uVar3 < uVar7 && -1 < (int)uVar3) {
            iVar10 = iVar10 + uVar3;
            goto LAB_00104703;
          }
        }
        if (!bVar2) {
          return;
        }
      }
      lVar11 = lVar11 + 4;
      uVar12 = uVar12 + 1;
    } while (lVar11 != 0x24);
    if ((((cf->can_id & 0x200) != 0) || (cf->data[6] != '\0')) || (cf->data[7] != '\0')) {
      iVar4 = snprintf(buf + iVar10,len - (long)iVar10,"%s",pcVar6);
      snprintf(buf + (iVar10 + iVar4),len - (long)(iVar10 + iVar4),"error-counter-tx-rx{{%d}{%d}}",
               (ulong)cf->data[6],(ulong)cf->data[7]);
      return;
    }
  }
  return;
}

Assistant:

void snprintf_can_error_frame(char *buf, size_t len, const struct canfd_frame *cf,
                  const char* sep)
{
	canid_t class, mask;
	int i, n = 0, classes = 0;
	char *defsep = ",";

	if (!(cf->can_id & CAN_ERR_FLAG))
		return;

	class = cf->can_id & CAN_EFF_MASK;
	if (class > (1 << ARRAY_SIZE(error_classes))) {
		fprintf(stderr, "Error class %#x is invalid\n", class);
		return;
	}

	if (!sep)
		sep = defsep;

	for (i = 0; i < (int)ARRAY_SIZE(error_classes); i++) {
		mask = 1 << i;
		if (class & mask) {
			int tmp_n = 0;
			if (classes){
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, "%s", sep);
				if (tmp_n < 0 || (size_t)tmp_n >= len - n){
					return;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", error_classes[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n){
				return;
			}
			n += tmp_n;
			if (mask == CAN_ERR_LOSTARB)
				n += snprintf_error_lostarb(buf + n, len - n,
							   cf);
			if (mask == CAN_ERR_CRTL)
				n += snprintf_error_ctrl(buf + n, len - n, cf);
			if (mask == CAN_ERR_PROT)
				n += snprintf_error_prot(buf + n, len - n, cf);
			classes++;
		}
	}

	if (cf->can_id & CAN_ERR_CNT || cf->data[6] || cf->data[7]) {
		n += snprintf(buf + n, len - n, "%s", sep);
		n += snprintf(buf + n, len - n, "error-counter-tx-rx{{%d}{%d}}",
			      cf->data[6], cf->data[7]);
	}
}